

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void nn_queue_push(nn_queue *self,nn_queue_item *item)

{
  nn_queue_item *item_local;
  nn_queue *self_local;
  
  if (item->next != (nn_queue_item *)0xffffffffffffffff) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","item->next == NN_QUEUE_NOTINQUEUE",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/queue.c",
            0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  item->next = (nn_queue_item *)0x0;
  if (self->head == (nn_queue_item *)0x0) {
    self->head = item;
  }
  if (self->tail != (nn_queue_item *)0x0) {
    self->tail->next = item;
  }
  self->tail = item;
  return;
}

Assistant:

void nn_queue_push (struct nn_queue *self, struct nn_queue_item *item)
{
    nn_assert (item->next == NN_QUEUE_NOTINQUEUE);

    item->next = NULL;
    if (!self->head)
        self->head = item;
    if (self->tail)
        self->tail->next = item;
    self->tail = item;
}